

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool ON_IntersectViewFrustumPlane
               (ON_Viewport *vp,ON_PlaneEquation *plane_equation,ON_SimpleArray<ON_3dPoint> *points)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint P_00;
  ON_3dPoint p;
  bool bVar4;
  view_projection vVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  ON_2dVector OVar9;
  double local_d40;
  double local_d30;
  ON_3dPoint local_ce0;
  ON_3dPoint local_cc8;
  ON_3dPoint local_cb0;
  double local_c98;
  double dStack_c90;
  double local_c88;
  ON_3dVector local_c78;
  ON_3dVector local_c60;
  ON_3dVector local_c48;
  ON_3dPoint local_c30;
  ON_3dPoint local_c18;
  ON_3dPoint local_c00;
  ON_3dVector local_be8;
  ON_3dVector local_bd0;
  ON_3dVector local_bb8;
  ON_3dPoint local_ba0;
  ON_3dPoint local_b88;
  ON_3dPoint local_b70;
  ON_3dVector local_b58;
  ON_3dVector local_b40;
  ON_3dVector local_b28;
  ON_3dPoint local_b10;
  ON_3dPoint local_af8;
  ON_3dPoint local_ae0;
  ON_3dVector local_ac8;
  ON_3dVector local_ab0;
  ON_3dVector local_a98;
  ON_3dPoint local_a80;
  ON_3dPoint local_a68;
  ON_3dPoint local_a50;
  ON_3dVector local_a38;
  ON_3dVector local_a20;
  ON_3dVector local_a08;
  ON_3dPoint local_9f0;
  ON_3dPoint local_9d8;
  ON_3dPoint local_9c0;
  ON_3dVector local_9a8;
  ON_3dVector local_990;
  ON_3dVector local_978;
  ON_3dPoint local_960;
  ON_3dPoint local_948;
  ON_3dPoint local_930;
  ON_3dVector local_918;
  ON_3dVector local_900;
  ON_3dVector local_8e8;
  ON_3dPoint local_8d0;
  ON_3dPoint local_8b8;
  ON_3dPoint local_8a0;
  ON_3dVector local_888;
  ON_3dVector local_870;
  ON_3dVector local_858;
  ON_3dPoint local_840;
  ON_3dPoint local_828;
  ON_3dPoint local_810;
  undefined4 local_7f8;
  undefined1 local_7e8 [8];
  ON_Plane plane;
  int ppt_count;
  int i1;
  int i0;
  int i;
  int e [12] [2];
  undefined1 local_6e0 [8];
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dPoint C;
  ON_2dVector D;
  ON_3dPoint P;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_3dPoint F [8];
  ON_PgonPt ppt_list [24];
  undefined1 local_e0 [8];
  ON_PgonPt ppt;
  double s;
  double v1;
  double v0;
  double v [8];
  double far_dist;
  double near_dist;
  double top;
  double bottom;
  double right;
  double left;
  ON_SimpleArray<ON_3dPoint> *points_local;
  ON_PlaneEquation *plane_equation_local;
  ON_Viewport *vp_local;
  
  left = (double)points;
  points_local = (ON_SimpleArray<ON_3dPoint> *)plane_equation;
  plane_equation_local = (ON_PlaneEquation *)vp;
  ON_Viewport::CameraLocation((ON_3dPoint *)&X.z,vp);
  ON_Viewport::CameraX((ON_3dVector *)&Y.z,(ON_Viewport *)plane_equation_local);
  ON_Viewport::CameraY((ON_3dVector *)&Z.z,(ON_Viewport *)plane_equation_local);
  ON_Viewport::CameraZ((ON_3dVector *)(e + 0xb),(ON_Viewport *)plane_equation_local);
  ON_3dVector::operator-((ON_3dVector *)local_6e0,(ON_3dVector *)(e + 0xb));
  memcpy(&i0,&DAT_00a26380,0x60);
  plane.plane_equation.d._0_4_ = 0;
  bVar4 = ON_Viewport::IsValidCamera((ON_Viewport *)plane_equation_local);
  if ((bVar4) &&
     (bVar4 = ON_Viewport::GetFrustum
                        ((ON_Viewport *)plane_equation_local,&right,&bottom,&top,&near_dist,
                         &far_dist,v + 7), bVar4)) {
    ON_Plane::ON_Plane((ON_Plane *)local_7e8,(ON_PlaneEquation *)points_local);
    bVar4 = ON_Plane::IsValid((ON_Plane *)local_7e8);
    if (bVar4) {
      vVar5 = ON_Viewport::Projection((ON_Viewport *)plane_equation_local);
      if (vVar5 == perspective_view) {
        local_d30 = v[7] / far_dist;
      }
      else {
        local_d30 = 1.0;
      }
      ppt.m_negcotangle = local_d30;
      operator*(&local_858,right,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_840,(ON_3dPoint *)&X.z,&local_858);
      operator*(&local_870,top,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_828,&local_840,&local_870);
      operator*(&local_888,far_dist,(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_810,&local_828,&local_888);
      F[0].y = local_810.z;
      F[0].x = local_810.y;
      operator*(&local_8e8,bottom,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_8d0,(ON_3dPoint *)&X.z,&local_8e8);
      operator*(&local_900,top,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_8b8,&local_8d0,&local_900);
      operator*(&local_918,far_dist,(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_8a0,&local_8b8,&local_918);
      F[1].y = local_8a0.z;
      F[0].z = local_8a0.x;
      F[1].x = local_8a0.y;
      operator*(&local_978,bottom,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_960,(ON_3dPoint *)&X.z,&local_978);
      operator*(&local_990,near_dist,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_948,&local_960,&local_990);
      operator*(&local_9a8,far_dist,(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_930,&local_948,&local_9a8);
      F[2].y = local_930.z;
      F[1].z = local_930.x;
      F[2].x = local_930.y;
      operator*(&local_a08,right,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_9f0,(ON_3dPoint *)&X.z,&local_a08);
      operator*(&local_a20,near_dist,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_9d8,&local_9f0,&local_a20);
      operator*(&local_a38,far_dist,(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_9c0,&local_9d8,&local_a38);
      F[3].y = local_9c0.z;
      F[2].z = local_9c0.x;
      F[3].x = local_9c0.y;
      operator*(&local_a98,ppt.m_negcotangle * right,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_a80,(ON_3dPoint *)&X.z,&local_a98);
      operator*(&local_ab0,ppt.m_negcotangle * top,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_a68,&local_a80,&local_ab0);
      operator*(&local_ac8,v[7],(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_a50,&local_a68,&local_ac8);
      F[4].y = local_a50.z;
      F[3].z = local_a50.x;
      F[4].x = local_a50.y;
      operator*(&local_b28,ppt.m_negcotangle * bottom,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_b10,(ON_3dPoint *)&X.z,&local_b28);
      operator*(&local_b40,ppt.m_negcotangle * top,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_af8,&local_b10,&local_b40);
      operator*(&local_b58,v[7],(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_ae0,&local_af8,&local_b58);
      F[5].y = local_ae0.z;
      F[4].z = local_ae0.x;
      F[5].x = local_ae0.y;
      operator*(&local_bb8,ppt.m_negcotangle * bottom,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_ba0,(ON_3dPoint *)&X.z,&local_bb8);
      operator*(&local_bd0,ppt.m_negcotangle * near_dist,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_b88,&local_ba0,&local_bd0);
      operator*(&local_be8,v[7],(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_b70,&local_b88,&local_be8);
      F[6].y = local_b70.z;
      F[5].z = local_b70.x;
      F[6].x = local_b70.y;
      operator*(&local_c48,ppt.m_negcotangle * right,(ON_3dVector *)&Y.z);
      ON_3dPoint::operator+(&local_c30,(ON_3dPoint *)&X.z,&local_c48);
      operator*(&local_c60,ppt.m_negcotangle * near_dist,(ON_3dVector *)&Z.z);
      ON_3dPoint::operator+(&local_c18,&local_c30,&local_c60);
      operator*(&local_c78,v[7],(ON_3dVector *)local_6e0);
      ON_3dPoint::operator+(&local_c00,&local_c18,&local_c78);
      F[6].z = local_c00.x;
      F[7].x = local_c00.y;
      F[7].y = local_c00.z;
      for (i1 = 0; i1 < 8; i1 = i1 + 1) {
        lVar6 = (long)i1;
        local_c88 = F[lVar6].y;
        local_c98 = F[lVar6 + -1].z;
        dStack_c90 = F[lVar6].x;
        P_00.y = dStack_c90;
        P_00.x = local_c98;
        P_00.z = local_c88;
        dVar8 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)points_local,P_00);
        v[(long)i1 + -1] = dVar8;
      }
      for (i1 = 0; i1 < 0xc; i1 = i1 + 1) {
        dVar8 = v[(long)(&i0)[(long)i1 * 2] + -1];
        dVar1 = v[(long)e[(long)i1 + -1][1] + -1];
        lVar6 = (long)(&i0)[(long)i1 * 2];
        P1.z = F[lVar6 + -1].z;
        dVar2 = F[lVar6].x;
        dVar3 = F[lVar6].y;
        lVar7 = (long)e[(long)i1 + -1][1];
        P.z = F[lVar7 + -1].z;
        P1.x = F[lVar7].x;
        P1.y = F[lVar7].y;
        if (((dVar8 <= 0.0) && (0.0 <= dVar1)) || ((0.0 <= dVar8 && (dVar1 <= 0.0)))) {
          if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) {
            ppt.m_negcotangle = dVar1 / (dVar1 - dVar8);
            operator*(&local_cc8,ppt.m_negcotangle,(ON_3dPoint *)&P1.z);
            operator*(&local_ce0,1.0 - ppt.m_negcotangle,(ON_3dPoint *)&P.z);
            ON_3dPoint::operator+(&local_cb0,&local_cc8,&local_ce0);
            P.x = local_cb0.y;
            P.y = local_cb0.z;
            lVar6 = (long)plane.plane_equation.d._0_4_;
            ppt_list[lVar6 + -1].m_negcotangle = local_cb0.x;
            ppt_list[lVar6].m_P.x = local_cb0.y;
            ppt_list[lVar6].m_P.y = local_cb0.z;
            plane.plane_equation.d._0_4_ = plane.plane_equation.d._0_4_ + 1;
          }
          else {
            lVar7 = (long)plane.plane_equation.d._0_4_;
            ppt_list[lVar7 + -1].m_negcotangle = F[lVar6 + -1].z;
            ppt_list[lVar7].m_P.x = dVar2;
            ppt_list[lVar7].m_P.y = dVar3;
            lVar6 = (long)(plane.plane_equation.d._0_4_ + 1);
            ppt_list[lVar6 + -1].m_negcotangle = P.z;
            ppt_list[lVar6].m_P.x = P1.x;
            ppt_list[lVar6].m_P.y = P1.y;
            plane.plane_equation.d._0_4_ = plane.plane_equation.d._0_4_ + 2;
          }
        }
      }
      if (plane.plane_equation.d._0_4_ < 1) {
        vp_local._7_1_ = 1;
      }
      else {
        ppt_count = 0;
        for (i1 = 0; i1 < plane.plane_equation.d._0_4_; i1 = i1 + 1) {
          lVar6 = (long)i1;
          p.y = ppt_list[lVar6].m_P.x;
          p.x = ppt_list[lVar6 + -1].m_negcotangle;
          p.z = ppt_list[lVar6].m_P.y;
          ON_Plane::ClosestPointTo((ON_Plane *)local_7e8,p,&ppt_list[i1].m_P.z,&ppt_list[i1].m_Q.x);
          if (ppt_list[i1].m_Q.x < ppt_list[ppt_count].m_Q.x) {
LAB_00990d2c:
            ppt_count = i1;
          }
          else {
            dVar8 = ppt_list[i1].m_Q.x;
            if (((dVar8 == ppt_list[ppt_count].m_Q.x) &&
                (!NAN(dVar8) && !NAN(ppt_list[ppt_count].m_Q.x))) &&
               (ppt_list[i1].m_P.z < ppt_list[ppt_count].m_P.z)) goto LAB_00990d2c;
          }
        }
        memcpy(local_e0,&ppt_list[(long)ppt_count + -1].m_negcotangle,0x30);
        if (ppt_count != 0) {
          memcpy(&ppt_list[(long)ppt_count + -1].m_negcotangle,&F[7].z,0x30);
          memcpy(&F[7].z,local_e0,0x30);
        }
        ppt_list[0].m_Q.y = -1.79769313486232e+308;
        for (i1 = 1; i1 < plane.plane_equation.d._0_4_; i1 = i1 + 1) {
          ppt_list[i1].m_P.z = ppt_list[i1].m_P.z - ppt_list[0].m_P.z;
          ppt_list[i1].m_Q.x = ppt_list[i1].m_Q.x - ppt_list[0].m_Q.x;
          if (0.0 < ppt_list[i1].m_Q.x) {
            local_d40 = -ppt_list[i1].m_P.z / ppt_list[i1].m_Q.x;
          }
          else {
            local_d40 = -1.79769313486232e+308;
          }
          ppt_list[i1].m_Q.y = local_d40;
        }
        ppt_list[0].m_P.z = 0.0;
        ppt_list[0].m_Q.x = 0.0;
        ON_qsort(&ppt_list[0].m_negcotangle,(long)(plane.plane_equation.d._0_4_ + -1),0x30,
                 comparePptAngle);
        ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)left,(ON_3dPoint *)&F[7].z)
        ;
        ppt_count = 0;
        plane.plane_equation.d._4_4_ = 1;
        OVar9 = ON_2dVector::operator-
                          ((ON_2dVector *)&ppt_list[1].m_P.z,(ON_2dVector *)&ppt_list[0].m_P.z);
        i1 = 2;
        while( true ) {
          D.x = OVar9.y;
          C.z = OVar9.x;
          if (plane.plane_equation.d._0_4_ <= i1) break;
          if ((ppt_list[i1].m_P.z - ppt_list[ppt_count].m_P.z) * D.x <
              (ppt_list[i1].m_Q.x - ppt_list[ppt_count].m_Q.x) * C.z) {
            ON_SimpleArray<ON_3dPoint>::Append
                      ((ON_SimpleArray<ON_3dPoint> *)left,
                       (ON_3dPoint *)
                       &ppt_list[(long)plane.plane_equation.d._4_4_ + -1].m_negcotangle);
            ppt_count = plane.plane_equation.d._4_4_;
          }
          plane.plane_equation.d._4_4_ = i1;
          OVar9 = ON_2dVector::operator-
                            ((ON_2dVector *)&ppt_list[i1].m_P.z,
                             (ON_2dVector *)&ppt_list[ppt_count].m_P.z);
          i1 = i1 + 1;
        }
        if (ppt_count < plane.plane_equation.d._4_4_) {
          ON_SimpleArray<ON_3dPoint>::Append
                    ((ON_SimpleArray<ON_3dPoint> *)left,
                     (ON_3dPoint *)&ppt_list[(long)plane.plane_equation.d._4_4_ + -1].m_negcotangle)
          ;
        }
        vp_local._7_1_ = 1;
      }
    }
    else {
      vp_local._7_1_ = 0;
    }
    local_7f8 = 1;
    ON_Plane::~ON_Plane((ON_Plane *)local_7e8);
  }
  else {
    vp_local._7_1_ = 0;
  }
  return (bool)(vp_local._7_1_ & 1);
}

Assistant:

bool ON_IntersectViewFrustumPlane( 
    const ON_Viewport& vp,
    const ON_PlaneEquation& plane_equation, 
    ON_SimpleArray<ON_3dPoint>& points 
    )
{

  double left, right, bottom, top, near_dist, far_dist;
  double v[8], v0, v1, s;
  ON_PgonPt ppt, ppt_list[24];
  ON_3dPoint F[8], P0, P1, P;
  ON_2dVector D;
  const ON_3dPoint  C = vp.CameraLocation();
  const ON_3dVector X = vp.CameraX();
  const ON_3dVector Y = vp.CameraY();
  const ON_3dVector Z = -vp.CameraZ();
  int e[12][2] = {{0,1},{1,2},{2,3},{3,0},
                  {4,5},{5,6},{6,7},{7,4},
                  {0,4},{1,5},{2,6},{3,7}};
  int i, i0, i1;
  int ppt_count = 0;

  if ( !vp.IsValidCamera() || !vp.GetFrustum(&left,&right,&bottom,&top,&near_dist,&far_dist) )
    return false;

  const ON_Plane plane(plane_equation);
  if ( !plane.IsValid() )
    return false;

  s = ON::perspective_view == vp.Projection() 
    ? far_dist/near_dist
    : 1.0;
  F[0] = C + left*X  + bottom*Y + near_dist*Z;
  F[1] = C + right*X + bottom*Y + near_dist*Z;
  F[2] = C + right*X + top*Y    + near_dist*Z;
  F[3] = C + left*X  + top*Y    + near_dist*Z;

  F[4] = C + s*left*X  + s*bottom*Y + far_dist*Z;
  F[5] = C + s*right*X + s*bottom*Y + far_dist*Z;
  F[6] = C + s*right*X + s*top*Y    + far_dist*Z;
  F[7] = C + s*left*X  + s*top*Y    + far_dist*Z;

  for ( i = 0; i < 8; i++ )
  {
    v[i] = plane_equation.ValueAt(F[i]);
  }

  for ( i = 0; i < 12; i++ )
  {
    v0 = v[e[i][0]];
    v1 = v[e[i][1]];
    P0 = F[e[i][0]];
    P1 = F[e[i][1]];
    if ( (v0 <= 0.0 && v1 >= 0.0) || (v0 >= 0.0 && v1 <= 0.0) )
    {
      if ( v0 == v1 )
      {
        ppt_list[ppt_count++].m_P = P0;
        ppt_list[ppt_count++].m_P = P1;
      }
      else
      {
        s = v1/(v1-v0);
        P = s*P0 + (1.0-s)*P1;
        ppt_list[ppt_count++].m_P = P;
      }
    }
  }

  if ( ppt_count <= 0 )
    return true; // plane misses frustum

  i0 = 0;
  for ( i = 0; i < ppt_count; i++ )
  {
    plane.ClosestPointTo( ppt_list[i].m_P, &ppt_list[i].m_Q.x, &ppt_list[i].m_Q.y );
    if (     ppt_list[i].m_Q.y < ppt_list[i0].m_Q.y 
         || (ppt_list[i].m_Q.y == ppt_list[i0].m_Q.y && ppt_list[i].m_Q.x < ppt_list[i0].m_Q.x) )
      i0 = i;
  }

  // Use Gram scan to get the convex hull and save it in points[].
  // See http://en.wikipedia.org/wiki/Graham_scan for details.

  // put point with smallest m_Q.y coordinate in ppt_list[0].
  ppt = ppt_list[i0];
  if ( i0 )
  {
    ppt_list[i0] = ppt_list[0];
    ppt_list[0] = ppt;
    i0 = 0;
  }

  // sort points by the angle (ppt_list[i].m_Q = ppt_list[0].m_Q) makes
  // with the positive x axis.  This is the same as sorting them by
  // -cot(angle) = -deltax/deltay.
  ppt_list[0].m_negcotangle = -ON_DBL_MAX; // -cot(0) = - infinity
  for ( i = 1; i < ppt_count; i++ )
  {
    ppt_list[i].m_Q.x -= ppt_list[0].m_Q.x;
    ppt_list[i].m_Q.y -= ppt_list[0].m_Q.y;
    ppt_list[i].m_negcotangle = (0.0 >= ppt_list[i].m_Q.y) ? -ON_DBL_MAX : -ppt_list[i].m_Q.x/ppt_list[i].m_Q.y;
  }
  ppt_list[0].m_Q.x = 0.0;
  ppt_list[0].m_Q.y = 0.0;
  ON_qsort(ppt_list+1,ppt_count-1,sizeof(ppt_list[0]),comparePptAngle);

  points.Append(ppt_list[0].m_P);
  i0 = 0;
  i1 = 1;
  D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;

  for ( i = 2; i < ppt_count; i++ )
  {
    if ( (ppt_list[i].m_Q.y - ppt_list[i0].m_Q.y)*D.x <= (ppt_list[i].m_Q.x - ppt_list[i0].m_Q.x)*D.y )
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "right" turn or collinear.
      // Drop ppt_list[i1].
      i1 = i;
    }
    else
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "left" turn.
      points.Append(ppt_list[i1].m_P);
      i0 = i1;
      i1 = i;
    }
    D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;
  }

  if ( i1 > i0 )
    points.Append(ppt_list[i1].m_P);

  return true;
}